

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcones2qc.h
# Opt level: O0

Context __thiscall
mp::
RQConeConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::Convert(RQConeConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
          *this,ItemType_conflict *ac,int param_3)

{
  double dVar1;
  value_type vVar2;
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  initializer_list<double> __l_01;
  initializer_list<int> __l_02;
  bool bVar3;
  const_reference pvVar4;
  reference pvVar5;
  const_reference pvVar6;
  reference pvVar7;
  LinTerms *this_00;
  iterator c_00;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *pAVar8;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *pAVar9;
  anon_struct_8_0_00000001_for___align in_RSI;
  BasicItemConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RDI;
  NodeRange NVar10;
  QuadConLE qc;
  vector<int,_std::allocator<int>_> xlin_1;
  vector<double,_std::allocator<double>_> clin_1;
  vector<int,_std::allocator<int>_> xlin;
  vector<double,_std::allocator<double>_> clin;
  size_type i;
  vector<double,_std::allocator<double>_> c12;
  vector<int,_std::allocator<int>_> x2;
  vector<int,_std::allocator<int>_> x1;
  Parameters *c;
  Arguments *x;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffea68;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_ffffffffffffea70;
  NodeIndexRange in_stack_ffffffffffffea78;
  QuadTerms *in_stack_ffffffffffffea80;
  const_iterator in_stack_ffffffffffffea88;
  undefined1 uVar11;
  QuadAndLinTerms *in_stack_ffffffffffffea90;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *in_stack_ffffffffffffea98;
  AlgConRhs<_1> in_stack_ffffffffffffeaa0;
  AlgConRhs<_1> rr;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffeaa8;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffeab0;
  QuadTerms *this_01;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffeab8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffeac0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffead0;
  vector<int,_std::allocator<int>_> *v;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffead8;
  vector<double,_std::allocator<double>_> *c_01;
  LinTerms *in_stack_ffffffffffffeae0;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> local_1440;
  AlgConRhs<_1> local_1260 [41];
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  NodeRange local_d00;
  AlgConRhs<_1> local_cf0 [171];
  double *local_798;
  double *local_790;
  int *local_780;
  int *local_778;
  int *local_768;
  int *local_760;
  vector<int,_std::allocator<int>_> local_74d [2];
  double local_718;
  double *local_710;
  undefined8 local_708;
  NodeRange local_6e8;
  AlgConRhs<_1> local_6d8 [171];
  double *local_180;
  double *local_178;
  int *local_168;
  int *local_160;
  int *local_150;
  int *local_148;
  value_type local_134;
  value_type *local_130;
  undefined8 local_128;
  double local_100;
  double *local_f8;
  undefined8 local_f0;
  size_type local_d0;
  double *local_c0;
  double *local_b8;
  double *local_b0;
  vector<double,_std::allocator<double>_> local_a8;
  undefined1 local_90 [104];
  type local_28;
  type local_18;
  Context local_4;
  
  local_18.__align = in_RSI;
  local_28.__align =
       (anon_struct_8_0_00000001_for___align)
       CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::RotatedQuadraticConeId>
       ::GetArguments((CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::RotatedQuadraticConeId>
                       *)((long)in_RSI + 0x20));
  local_90._96_8_ =
       CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::RotatedQuadraticConeId>
       ::GetParameters((CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::RotatedQuadraticConeId>
                        *)((long)local_18.__align + 0x20));
  local_90._56_8_ =
       std::vector<int,_std::allocator<int>_>::begin
                 ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffea68);
  local_90._64_8_ =
       __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                 ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                  in_stack_ffffffffffffea78,(difference_type)in_stack_ffffffffffffea70);
  local_90._48_8_ =
       std::vector<int,_std::allocator<int>_>::end
                 ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffea68);
  std::allocator<int>::allocator((allocator<int> *)0x5dd869);
  std::vector<int,std::allocator<int>>::
  vector<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,void>
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffeaa0.rhs_,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             in_stack_ffffffffffffeab0._M_current,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             in_stack_ffffffffffffeaa8._M_current,(allocator_type *)in_stack_ffffffffffffea98);
  std::allocator<int>::~allocator((allocator<int> *)0x5dd89d);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeab8);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_28.__align,0);
  vVar2 = *pvVar4;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_90,0);
  *pvVar5 = vVar2;
  local_b8 = (double *)
             std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffea68);
  local_b0 = (double *)
             __gnu_cxx::
             __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator+((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                        *)in_stack_ffffffffffffea78,(difference_type)in_stack_ffffffffffffea70);
  local_c0 = (double *)std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffea68);
  std::allocator<double>::allocator((allocator<double> *)0x5dd94d);
  std::vector<double,std::allocator<double>>::
  vector<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,void>
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffeaa0.rhs_,
             in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8,
             (allocator_type *)in_stack_ffffffffffffea98);
  std::allocator<double>::~allocator((allocator<double> *)0x5dd981);
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_90._96_8_,0);
  dVar1 = *pvVar6;
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_a8,0);
  *pvVar7 = dVar1 * -2.0 * *pvVar7;
  local_d0 = std::vector<double,_std::allocator<double>_>::size(&local_a8);
  while (local_d0 = local_d0 - 1, local_d0 != 0) {
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_a8,local_d0);
    dVar1 = *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_a8,local_d0);
    *pvVar7 = dVar1 * *pvVar7;
  }
  BasicItemConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC(in_RDI);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(local_90 + 0x48),0);
  bVar3 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::is_fixed(in_stack_ffffffffffffea70,(int)((ulong)in_stack_ffffffffffffea68 >> 0x20));
  if (bVar3) {
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_a8,0);
    dVar1 = *pvVar7;
    BasicItemConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::GetMC(in_RDI);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(local_90 + 0x48),0);
    local_100 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                ::fixed_value(in_stack_ffffffffffffea70,
                              (int)((ulong)in_stack_ffffffffffffea68 >> 0x20));
    local_100 = dVar1 * local_100;
    local_f8 = &local_100;
    local_f0 = 1;
    std::allocator<double>::allocator((allocator<double> *)0x5ddb92);
    __l._M_len = (size_type)in_stack_ffffffffffffeab0._M_current;
    __l._M_array = in_stack_ffffffffffffeaa8._M_current;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffeaa0.rhs_,__l,
               (allocator_type *)in_stack_ffffffffffffea98);
    std::allocator<double>::~allocator((allocator<double> *)0x5ddbc6);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_90,0);
    local_134 = *pvVar5;
    local_130 = &local_134;
    local_128 = 1;
    std::allocator<int>::allocator((allocator<int> *)0x5ddc11);
    __l_00._M_len = (size_type)in_stack_ffffffffffffeab0._M_current;
    __l_00._M_array = (iterator)in_stack_ffffffffffffeaa8._M_current;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffeaa0.rhs_,__l_00,
               (allocator_type *)in_stack_ffffffffffffea98);
    std::allocator<int>::~allocator((allocator<int> *)0x5ddc45);
    local_148 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                 ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffea68);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_ffffffffffffea70,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_ffffffffffffea68);
    local_150 = (int *)std::vector<int,_std::allocator<int>_>::erase
                                 ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffea80,
                                  (const_iterator)in_stack_ffffffffffffea88._M_current);
    local_160 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                 ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffea68);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_ffffffffffffea70,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_ffffffffffffea68);
    local_168 = (int *)std::vector<int,_std::allocator<int>_>::erase
                                 ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffea80,
                                  (const_iterator)in_stack_ffffffffffffea88._M_current);
    local_178 = (double *)
                std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffea68);
    __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
    __normal_iterator<double*>
              ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_ffffffffffffea70,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_ffffffffffffea68);
    local_180 = (double *)
                std::vector<double,_std::allocator<double>_>::erase
                          ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffea80,
                           in_stack_ffffffffffffea88);
    BasicItemConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::GetMC(in_RDI);
    LinTerms::LinTerms(in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8,in_stack_ffffffffffffead0
                      );
    QuadTerms::QuadTerms
              ((QuadTerms *)in_stack_ffffffffffffeab0._M_current,
               (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffeaa8._M_current,
               (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffeaa0.rhs_,
               (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffea98);
    QuadAndLinTerms::QuadAndLinTerms
              (in_stack_ffffffffffffea90,(LinTerms *)in_stack_ffffffffffffea88._M_current,
               in_stack_ffffffffffffea80);
    uVar11 = (undefined1)((ulong)in_stack_ffffffffffffea88._M_current >> 0x38);
    AlgConRhs<-1>::AlgConRhs(local_6d8,0.0);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
              (in_stack_ffffffffffffea98,in_stack_ffffffffffffea90,in_stack_ffffffffffffeaa0,
               (bool)uVar11);
    local_6e8 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
                ::AddConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>>
                          ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                            *)in_stack_ffffffffffffeaa0.rhs_,in_stack_ffffffffffffea98);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint
              ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *)
               in_stack_ffffffffffffea70);
    QuadAndLinTerms::~QuadAndLinTerms((QuadAndLinTerms *)in_stack_ffffffffffffea70);
    QuadTerms::~QuadTerms((QuadTerms *)in_stack_ffffffffffffea70);
    LinTerms::~LinTerms((LinTerms *)in_stack_ffffffffffffea70);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffea80);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffea80);
    NVar10.ir_ = in_stack_ffffffffffffea78;
    NVar10.pvn_ = (ValueNode *)in_stack_ffffffffffffea80;
  }
  else {
    BasicItemConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::GetMC(in_RDI);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)local_90,0);
    bVar3 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::is_fixed(in_stack_ffffffffffffea70,(int)((ulong)in_stack_ffffffffffffea68 >> 0x20));
    if (bVar3) {
      c_01 = (vector<double,_std::allocator<double>_> *)0x0;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_a8,0);
      dVar1 = *pvVar7;
      this_00 = (LinTerms *)
                BasicItemConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                ::GetMC(in_RDI);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)local_90,(size_type)c_01);
      local_718 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                  ::fixed_value(in_stack_ffffffffffffea70,
                                (int)((ulong)in_stack_ffffffffffffea68 >> 0x20));
      local_718 = dVar1 * local_718;
      local_710 = &local_718;
      local_708 = 1;
      std::allocator<double>::allocator((allocator<double> *)0x5de09c);
      __l_01._M_len = (size_type)in_stack_ffffffffffffeab0._M_current;
      __l_01._M_array = in_stack_ffffffffffffeaa8._M_current;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffeaa0.rhs_,__l_01,
                 (allocator_type *)in_stack_ffffffffffffea98);
      std::allocator<double>::~allocator((allocator<double> *)0x5de0d0);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_90 + 0x48),0);
      local_74d[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._1_4_ = *pvVar5;
      local_74d[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _5_8_ = (long)&local_74d[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + 1;
      local_74d[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _13_8_ = 1;
      v = local_74d;
      std::allocator<int>::allocator((allocator<int> *)0x5de118);
      __l_02._M_len = (size_type)in_stack_ffffffffffffeab0._M_current;
      __l_02._M_array = (iterator)in_stack_ffffffffffffeaa8._M_current;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffeaa0.rhs_,__l_02,
                 (allocator_type *)in_stack_ffffffffffffea98);
      std::allocator<int>::~allocator((allocator<int> *)0x5de149);
      local_760 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                   ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffea68);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 in_stack_ffffffffffffea70,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 in_stack_ffffffffffffea68);
      local_768 = (int *)std::vector<int,_std::allocator<int>_>::erase
                                   ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffea80,
                                    (const_iterator)in_stack_ffffffffffffea88._M_current);
      this_01 = (QuadTerms *)local_90;
      local_778 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                   ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffea68);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 in_stack_ffffffffffffea70,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 in_stack_ffffffffffffea68);
      local_780 = (int *)std::vector<int,_std::allocator<int>_>::erase
                                   ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffea80,
                                    (const_iterator)in_stack_ffffffffffffea88._M_current);
      rr.rhs_ = (double)&local_a8;
      local_790 = (double *)
                  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffea68);
      __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
      __normal_iterator<double*>
                ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *
                 )in_stack_ffffffffffffea70,
                 (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                 in_stack_ffffffffffffea68);
      c_00 = std::vector<double,_std::allocator<double>_>::erase
                       ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffea80,
                        in_stack_ffffffffffffea88);
      local_798 = c_00._M_current;
      pAVar8 = (AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *)
               BasicItemConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ::GetMC(in_RDI);
      LinTerms::LinTerms(this_00,c_01,v);
      QuadTerms::QuadTerms
                (this_01,(vector<double,_std::allocator<double>_> *)c_00._M_current,
                 (vector<int,_std::allocator<int>_> *)rr.rhs_,
                 (vector<int,_std::allocator<int>_> *)pAVar8);
      QuadAndLinTerms::QuadAndLinTerms
                (in_stack_ffffffffffffea90,(LinTerms *)in_stack_ffffffffffffea88._M_current,
                 in_stack_ffffffffffffea80);
      uVar11 = (undefined1)((ulong)in_stack_ffffffffffffea88._M_current >> 0x38);
      AlgConRhs<-1>::AlgConRhs(local_cf0,0.0);
      AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
                (pAVar8,in_stack_ffffffffffffea90,rr,(bool)uVar11);
      local_d00 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
                  ::AddConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>>
                            ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                              *)rr.rhs_,pAVar8);
      AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint
                ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *)
                 in_stack_ffffffffffffea70);
      QuadAndLinTerms::~QuadAndLinTerms((QuadAndLinTerms *)in_stack_ffffffffffffea70);
      QuadTerms::~QuadTerms((QuadTerms *)in_stack_ffffffffffffea70);
      LinTerms::~LinTerms((LinTerms *)in_stack_ffffffffffffea70);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffea80);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffea80);
      NVar10.ir_ = in_stack_ffffffffffffea78;
      NVar10.pvn_ = (ValueNode *)in_stack_ffffffffffffea80;
    }
    else {
      local_10b8 = 0;
      uStack_10b0 = 0;
      local_10c8 = 0;
      uStack_10c0 = 0;
      local_10d8 = 0;
      uStack_10d0 = 0;
      local_10e8 = 0;
      uStack_10e0 = 0;
      local_10f8 = 0;
      uStack_10f0 = 0;
      local_1108 = 0;
      uStack_1100 = 0;
      local_1118 = 0;
      uStack_1110 = 0;
      local_10a8 = 0;
      LinTerms::LinTerms((LinTerms *)in_stack_ffffffffffffea70);
      QuadTerms::QuadTerms
                ((QuadTerms *)in_stack_ffffffffffffeab0._M_current,
                 (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffeaa8._M_current,
                 (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffeaa0.rhs_,
                 (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffea98);
      QuadAndLinTerms::QuadAndLinTerms
                (in_stack_ffffffffffffea90,(LinTerms *)in_stack_ffffffffffffea88._M_current,
                 in_stack_ffffffffffffea80);
      uVar11 = (undefined1)((ulong)in_stack_ffffffffffffea88._M_current >> 0x38);
      AlgConRhs<-1>::AlgConRhs(local_1260,0.0);
      AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
                (in_stack_ffffffffffffea98,in_stack_ffffffffffffea90,in_stack_ffffffffffffeaa0,
                 (bool)uVar11);
      QuadAndLinTerms::~QuadAndLinTerms((QuadAndLinTerms *)in_stack_ffffffffffffea70);
      QuadTerms::~QuadTerms((QuadTerms *)in_stack_ffffffffffffea70);
      LinTerms::~LinTerms((LinTerms *)in_stack_ffffffffffffea70);
      pAVar9 = (AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *)
               BasicItemConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ::GetMC(in_RDI);
      pAVar8 = &local_1440;
      AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
                (pAVar8,pAVar9);
      NVar10 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
               ::AddConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>>
                         ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                           *)in_stack_ffffffffffffeaa0.rhs_,in_stack_ffffffffffffea98);
      AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint(pAVar8);
      AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint(pAVar8);
    }
  }
  Context::Context(&local_4,CTX_ROOT);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)NVar10.pvn_);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)NVar10.pvn_);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)NVar10.pvn_);
  return (Context)local_4.value_;
}

Assistant:

Context Convert(const ItemType& ac, int ) {
    const auto& x = ac.GetArguments();
    const auto& c = ac.GetParameters();
    std::vector<int> x1{x.begin()+1, x.end()};
    auto x2 = x1;
    x2[0] = x[0];
    std::vector<double> c12{c.begin()+1, c.end()};
    c12[0] *= -2.0*c[0];
    for (auto i=c12.size(); --i; )
      c12[i] *= c12[i];
    // Reproduce linear term, for Mosek & COPT. conic/socp_11.
    if (GetMC().is_fixed(x1[0])) {
      std::vector<double> clin
          = { c12[0] * GetMC().fixed_value(x1[0]) };
      std::vector<int> xlin = { x2[0] };
      x1.erase(x1.begin());
      x2.erase(x2.begin());
      c12.erase(c12.begin());
      GetMC().AddConstraint(
            QuadConLE{ {{clin, xlin}, {c12, x1, x2}}, {0.0} });
    } else
      if (GetMC().is_fixed(x2[0])) {
        std::vector<double> clin
            = { c12[0] * GetMC().fixed_value(x2[0]) };
        std::vector<int> xlin = { x1[0] };
        x1.erase(x1.begin());
        x2.erase(x2.begin());
        c12.erase(c12.begin());
        GetMC().AddConstraint(
              QuadConLE{ {{clin, xlin}, {c12, x1, x2}}, {0.0} });
      } else {
        auto qc = QuadConLE{ {{}, {c12, x1, x2}}, {0.0} };
        GetMC().AddConstraint(std::move(qc));
      }
      return Context::CTX_ROOT;
  }